

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCAABBTree.cpp
# Opt level: O2

int chrono::collision::build_recurse
              (CHAABBTree *m,int bn,int first_geo,int num_geos,double envelope)

{
  vector<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_> *__x;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  pointer ppCVar5;
  ChGeometry *pCVar6;
  undefined8 uVar7;
  byte bVar8;
  uint num_geos_00;
  CHAABBTree *m_00;
  ulong uVar9;
  int iVar10;
  int i;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  long *plVar14;
  CHAABB *this;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  ushort uVar18;
  ushort uVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double local_118;
  double dStack_110;
  double local_108;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  CHAABBTree *local_d0;
  ulong local_c8;
  long local_c0;
  long local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  long local_88;
  undefined8 uStack_80;
  long local_78;
  undefined8 uStack_70;
  long local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  _Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
  local_48;
  
  __x = &(m->super_ChCollisionTree).geometries;
  local_c0 = (long)bn * 0x38;
  this = (m->b).
         super__Vector_base<chrono::collision::CHAABB,_std::allocator<chrono::collision::CHAABB>_>.
         _M_impl.super__Vector_impl_data._M_start + bn;
  std::vector<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>::
  vector((vector<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_> *)
         &local_48,__x);
  CHAABB::FitToGeometries
            (this,(vector<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
                   *)&local_48,first_geo,num_geos,envelope);
  std::_Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
  ::~_Vector_base(&local_48);
  if (num_geos == 1) {
    this->first_child = ~first_geo;
  }
  else if (1 < num_geos) {
    iVar10 = m->current_box;
    this->first_child = iVar10;
    m->current_box = iVar10 + 2;
    uVar16 = (ulong)(uint)num_geos;
    dVar1 = (this->d).m_data[0];
    local_98._8_8_ = 0;
    local_98._0_8_ = dVar1;
    dVar2 = (this->d).m_data[1];
    local_a8._8_8_ = 0;
    local_a8._0_8_ = dVar2;
    local_e8._8_8_ = 0;
    local_e8._0_8_ = VECT_X;
    plVar14 = (long *)&VECT_X;
    if (dVar1 < dVar2) {
      plVar14 = &VECT_Y;
    }
    local_f8._8_8_ = 0;
    local_f8._0_8_ = DAT_011dd400;
    local_b8 = VECT_Y;
    uStack_b0 = 0;
    local_78 = DAT_011dd418;
    uStack_70 = 0;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = (this->d).m_data[2];
    local_88 = VECT_Z;
    uStack_80 = 0;
    uVar7 = vcmppd_avx512vl(local_a8,auVar21,1);
    uVar18 = (ushort)uVar7 & 3;
    uVar7 = vcmppd_avx512vl(local_98,auVar21,1);
    uVar19 = (ushort)uVar7 & 3;
    if (((uVar19 | uVar18) & 1) != 0) {
      plVar14 = &VECT_Z;
    }
    local_68 = DAT_011dd430;
    uStack_60 = 0;
    dVar1 = (double)((ulong *)plVar14)[1];
    lVar11 = (long)first_geo;
    uVar13 = uVar16;
    lVar15 = lVar11;
    auVar25 = _VNULL;
    dVar2 = DAT_011dd3e8;
    local_d0 = m;
    local_c8 = (ulong)(uint)first_geo;
    while( true ) {
      uVar9 = local_c8;
      bVar17 = uVar13 == 0;
      uVar13 = uVar13 - 1;
      if (bVar17) break;
      local_58 = auVar25;
      (*(__x->
        super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
        )._M_impl.super__Vector_impl_data._M_start[lVar15]->_vptr_ChGeometry[6])(&local_118);
      lVar15 = lVar15 + 1;
      auVar25._0_8_ = (double)local_58._0_8_ + local_118;
      auVar25._8_8_ = (double)local_58._8_8_ + dStack_110;
      dVar2 = dVar2 + local_108;
    }
    bVar17 = (double)local_98._0_8_ < (double)local_a8._0_8_;
    uVar12 = 0;
    bVar8 = (byte)uVar19 | (byte)uVar18;
    local_e8._0_8_ =
         (ulong)(bVar8 & 1) * local_88 +
         (ulong)!(bool)(bVar8 & 1) * ((ulong)bVar17 * local_b8 + (ulong)!bVar17 * local_e8._0_8_);
    local_f8._0_8_ =
         (ulong)(bVar8 & 1) * local_68 +
         (ulong)!(bool)(bVar8 & 1) * ((ulong)bVar17 * local_78 + (ulong)!bVar17 * local_f8._0_8_);
    dVar20 = (double)num_geos;
    auVar24._0_8_ = auVar25._0_8_ / dVar20;
    auVar24._8_8_ = auVar25._8_8_;
    auVar21 = vshufpd_avx(auVar25,auVar25,1);
    auVar22._0_8_ = dVar2 / dVar20;
    auVar22._8_8_ = 0;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = (auVar21._0_8_ / dVar20) * dVar1;
    auVar21 = vfmadd231sd_fma(auVar26,local_e8,auVar24);
    auVar21 = vfmadd231sd_fma(auVar21,local_f8,auVar22);
    while (lVar15 = local_c0, m_00 = local_d0, bVar17 = uVar16 != 0, uVar16 = uVar16 - 1,
          iVar10 = (int)uVar9, bVar17) {
      (*(__x->
        super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
        )._M_impl.super__Vector_impl_data._M_start[lVar11]->_vptr_ChGeometry[6])(&local_118);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_118;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar1 * dStack_110;
      auVar25 = vfmadd231sd_fma(auVar23,local_e8,auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_108;
      auVar25 = vfmadd231sd_fma(auVar25,local_f8,auVar4);
      if (auVar25._0_8_ <= auVar21._0_8_) {
        ppCVar5 = (__x->
                  super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        iVar10 = uVar12 + iVar10;
        uVar12 = uVar12 + 1;
        pCVar6 = ppCVar5[lVar11];
        ppCVar5[lVar11] = ppCVar5[iVar10];
        (__x->
        super__Vector_base<chrono::geometry::ChGeometry_*,_std::allocator<chrono::geometry::ChGeometry_*>_>
        )._M_impl.super__Vector_impl_data._M_start[iVar10] = pCVar6;
      }
      lVar11 = lVar11 + 1;
    }
    num_geos_00 = uVar12;
    if (uVar12 == num_geos) {
      num_geos_00 = (uint)num_geos >> 1;
    }
    if (uVar12 == 0) {
      num_geos_00 = (uint)num_geos >> 1;
    }
    build_recurse(local_d0,*(int *)((long)(&((local_d0->b).
                                             super__Vector_base<chrono::collision::CHAABB,_std::allocator<chrono::collision::CHAABB>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->d + 1) +
                                   local_c0),iVar10,num_geos_00,envelope);
    build_recurse(m_00,*(int *)((long)(&((m_00->b).
                                         super__Vector_base<chrono::collision::CHAABB,_std::allocator<chrono::collision::CHAABB>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->d + 1) + lVar15
                               ) + 1,iVar10 + num_geos_00,num_geos - num_geos_00,envelope);
  }
  return 0;
}

Assistant:

int build_recurse(CHAABBTree* m, int bn, int first_geo, int num_geos, double envelope) {
    CHAABB* b = m->child(bn);

    double coord;
    Vector axis;
    Vector mean;

    // fit the BV

    b->FitToGeometries(m->geometries, first_geo, num_geos, envelope);

    if (num_geos == 1) {
        // BV is a leaf BV - first_child will index a triangle

        b->first_child = -(first_geo + 1);
    } else if (num_geos > 1) {
        // BV not a leaf - first_child will index a BV

        b->first_child = m->current_box;
        m->current_box += 2;

        // choose splitting axis

        axis = VECT_X;
        if (b->d.y() > b->d.x())
            axis = VECT_Y;
        if (b->d.z() > b->d.y())
            axis = VECT_Z;
        if (b->d.z() > b->d.x())
            axis = VECT_Z;

        // choose splitting coord

        get_centroid_geometries(mean, m->geometries, first_geo, num_geos);

        coord = Vdot(axis, mean);

        //*** TO DO***??? other splitting criterion??

        // now split

        int num_first_half = split_geometries(m->geometries, first_geo, num_geos, axis, coord);

        // recursively build the children

        build_recurse(m, m->child(bn)->first_child, first_geo, num_first_half, envelope);
        build_recurse(m, m->child(bn)->first_child + 1, first_geo + num_first_half, num_geos - num_first_half,
                      envelope);
    }

    return ChC_OK;
}